

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * __thiscall
Diligent::GetBufferModeString(Diligent::BUFFER_MODE)::BufferModeToStringMap::operator[](Diligent::
BUFFER_MODE__const(void *this,BUFFER_MODE Mode)

{
  const_reference ppcVar1;
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  BUFFER_MODE Mode_local;
  BufferModeToStringMap *this_local;
  
  msg.field_2._M_local_buf[0xf] = Mode;
  if (Mode < BUFFER_MODE_NUM_MODES) {
    ppcVar1 = std::array<const_char_*,_4UL>::operator[]
                        ((array<const_char_*,_4UL> *)this,(ulong)Mode);
    this_local = (BufferModeToStringMap *)*ppcVar1;
  }
  else {
    FormatString<char[20]>((string *)local_40,(char (*) [20])"Unknown buffer mode");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x525);
    std::__cxx11::string::~string((string *)local_40);
    this_local = (BufferModeToStringMap *)anon_var_dwarf_ccf47f;
  }
  return (Char *)this_local;
}

Assistant:

const Char* operator[](BUFFER_MODE Mode) const
        {
            if (Mode >= BUFFER_MODE_UNDEFINED && Mode < BUFFER_MODE_NUM_MODES)
                return BufferModeStrings[Mode];
            else
            {
                UNEXPECTED("Unknown buffer mode");
                return "Unknown buffer mode";
            }
        }